

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_unsigned_long_&,_const_long_long_&> * __thiscall
Catch::ExprLhs<unsigned_long_const&>::operator>
          (BinaryExpr<const_unsigned_long_&,_const_long_long_&> *__return_storage_ptr__,
          ExprLhs<unsigned_long_const&> *this,longlong *rhs)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  StringRef local_40;
  
  puVar1 = *(ulong **)this;
  uVar2 = *puVar1;
  uVar3 = *rhs;
  StringRef::StringRef(&local_40,">");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = uVar3 < uVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00572de8;
  __return_storage_ptr__->m_lhs = puVar1;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator > ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs > rhs), m_lhs, ">", rhs };
        }